

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BorderAmounts_EdgeSizes::SharedCtor(BorderAmounts_EdgeSizes *this)

{
  BorderAmounts_EdgeSizes *this_local;
  
  memset(&this->startedgesize_,0,0x10);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void BorderAmounts_EdgeSizes::SharedCtor() {
  ::memset(&startedgesize_, 0, reinterpret_cast<char*>(&endedgesize_) -
    reinterpret_cast<char*>(&startedgesize_) + sizeof(endedgesize_));
  _cached_size_ = 0;
}